

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O3

void __thiscall
cmComputeLinkInformation::cmComputeLinkInformation
          (cmComputeLinkInformation *this,cmGeneratorTarget *target,string *config)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Rb_tree_header *p_Var3;
  long lVar4;
  cmGlobalGenerator *pcVar5;
  cmGeneratorTarget *pcVar6;
  size_type sVar7;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *this_00;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *implicitDirs;
  unique_ptr<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_> *puVar8;
  bool bVar9;
  TargetType TVar10;
  PolicyStatus PVar11;
  cmMakefile *pcVar12;
  cmLocalGenerator *pcVar13;
  cmState *this_01;
  cmOrderDirectories *pcVar14;
  cmValue cVar15;
  string *psVar16;
  char *pcVar17;
  pointer pcVar18;
  pointer __p;
  _Alloc_hider __v;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_02;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_03;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_04;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_05;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_06;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_07;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_08;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_09;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  directories;
  _Alloc_node __an;
  string rlVar;
  string rtSepVar;
  string local_388;
  char *local_368;
  undefined8 local_360;
  undefined1 local_358 [40];
  _Alloc_hider local_330;
  size_type local_328;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_320;
  _Alloc_hider local_310;
  pointer local_308;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_300;
  _Alloc_hider local_2f0;
  size_type local_2e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e0;
  _Alloc_hider local_2d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c0;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
  *local_2b0;
  unique_ptr<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_> *local_2a8;
  unique_ptr<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_> *local_2a0;
  string *local_298;
  string *local_290;
  string *local_288;
  string *local_280;
  string *local_278;
  string *local_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_260;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_258;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_250;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_238;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_230;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_208;
  string *local_200;
  string *local_1f8;
  string *local_1f0;
  string *local_1e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1e0;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_1d8;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1d0;
  unique_ptr<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_> *local_1c8;
  cmGeneratorTarget *local_1c0;
  string local_1b8;
  string *local_198;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  p_Var1 = &(this->SharedLibrariesLinked)._M_t._M_impl.super__Rb_tree_header;
  (this->SharedLibrariesLinked)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->SharedLibrariesLinked)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_298 = config;
  memset(this,0,0x90);
  (this->SharedLibrariesLinked)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->SharedLibrariesLinked)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->SharedLibrariesLinked)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->ExternalObjectTargets).
  super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ExternalObjectTargets).
  super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ExternalObjectTargets).
  super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->RuntimeDLLs).
  super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->RuntimeDLLs).
  super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->RuntimeDLLs).
  super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->Target = target;
  pcVar12 = cmTarget::GetMakefile(target->Target);
  this->Makefile = pcVar12;
  pcVar13 = cmGeneratorTarget::GetLocalGenerator(target);
  pcVar5 = pcVar13->GlobalGenerator;
  this->GlobalGenerator = pcVar5;
  this->CMakeInstance = pcVar5->CMakeInstance;
  local_198 = &this->Config;
  local_208 = &(this->Config).field_2;
  (this->Config)._M_dataplus._M_p = (pointer)local_208;
  pcVar18 = (local_298->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_198,pcVar18,pcVar18 + local_298->_M_string_length);
  local_270 = &this->LinkLanguage;
  local_210 = &(this->LinkLanguage).field_2;
  (this->LinkLanguage)._M_dataplus._M_p = (pointer)local_210;
  (this->LinkLanguage)._M_string_length = 0;
  (this->LinkLanguage).field_2._M_local_buf[0] = '\0';
  (this->LoaderFlag).Value = (string *)0x0;
  local_278 = (string *)&this->LibLinkFlag;
  local_218 = &(this->LibLinkFlag).field_2;
  (this->LibLinkFlag)._M_dataplus._M_p = (pointer)local_218;
  (this->LibLinkFlag)._M_string_length = 0;
  (this->LibLinkFlag).field_2._M_local_buf[0] = '\0';
  local_220 = &(this->LibLinkFileFlag).field_2;
  (this->LibLinkFileFlag)._M_dataplus._M_p = (pointer)local_220;
  (this->LibLinkFileFlag)._M_string_length = 0;
  (this->LibLinkFileFlag).field_2._M_local_buf[0] = '\0';
  local_228 = &(this->ObjLinkFileFlag).field_2;
  (this->ObjLinkFileFlag)._M_dataplus._M_p = (pointer)local_228;
  (this->ObjLinkFileFlag)._M_string_length = 0;
  (this->ObjLinkFileFlag).field_2._M_local_buf[0] = '\0';
  local_230 = &(this->LibLinkSuffix).field_2;
  (this->LibLinkSuffix)._M_dataplus._M_p = (pointer)local_230;
  (this->LibLinkSuffix)._M_string_length = 0;
  (this->LibLinkSuffix).field_2._M_local_buf[0] = '\0';
  local_238 = &(this->RuntimeFlag).field_2;
  (this->RuntimeFlag)._M_dataplus._M_p = (pointer)local_238;
  (this->RuntimeFlag)._M_string_length = 0;
  (this->RuntimeFlag).field_2._M_local_buf[0] = '\0';
  local_240 = &(this->RuntimeSep).field_2;
  (this->RuntimeSep)._M_dataplus._M_p = (pointer)local_240;
  (this->RuntimeSep)._M_string_length = 0;
  (this->RuntimeSep).field_2._M_local_buf[0] = '\0';
  local_248 = &(this->RuntimeAlways).field_2;
  (this->RuntimeAlways)._M_dataplus._M_p = (pointer)local_248;
  (this->RuntimeAlways)._M_string_length = 0;
  (this->RuntimeAlways).field_2._M_local_buf[0] = '\0';
  local_250 = &(this->RPathLinkFlag).field_2;
  (this->RPathLinkFlag)._M_dataplus._M_p = (pointer)local_250;
  (this->RPathLinkFlag)._M_string_length = 0;
  (this->RPathLinkFlag).field_2._M_local_buf[0] = '\0';
  local_258 = &(this->StaticLinkTypeFlag).field_2;
  (this->StaticLinkTypeFlag)._M_dataplus._M_p = (pointer)local_258;
  (this->StaticLinkTypeFlag)._M_string_length = 0;
  (this->StaticLinkTypeFlag).field_2._M_local_buf[0] = '\0';
  local_260 = &(this->SharedLinkTypeFlag).field_2;
  (this->SharedLinkTypeFlag)._M_dataplus._M_p = (pointer)local_260;
  (this->SharedLinkTypeFlag)._M_string_length = 0;
  (this->SharedLinkTypeFlag).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->LinkPrefixes)._M_t._M_impl.super__Rb_tree_header;
  (this->LinkPrefixes)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->LinkPrefixes)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->LinkExtensions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->LinkExtensions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->LinkExtensions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->SharedLinkExtensions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->SharedLinkExtensions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->StaticLinkExtensions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->SharedLinkExtensions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->StaticLinkExtensions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->StaticLinkExtensions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->LinkPrefixes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->LinkPrefixes)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  local_280 = (string *)&this->LibLinkFileFlag;
  (this->ExtractStaticLibraryName).regmust = (char *)0x0;
  (this->ExtractStaticLibraryName).program = (char *)0x0;
  (this->ExtractStaticLibraryName).progsize = 0;
  (this->ExtractSharedLibraryName).regmust = (char *)0x0;
  (this->ExtractSharedLibraryName).program = (char *)0x0;
  (this->ExtractSharedLibraryName).progsize = 0;
  local_290 = (string *)&this->ObjLinkFileFlag;
  local_288 = (string *)&this->LibLinkSuffix;
  local_1e8 = (string *)&this->RuntimeFlag;
  local_1f0 = (string *)&this->RuntimeSep;
  local_1f8 = (string *)&this->RuntimeAlways;
  local_200 = (string *)&this->RPathLinkFlag;
  local_1c0 = target;
  memset(&this->ExtractSharedLibraryName,0,0x20a);
  (this->ExtractAnyLibraryName).regmust = (char *)0x0;
  (this->ExtractAnyLibraryName).program = (char *)0x0;
  (this->ExtractAnyLibraryName).progsize = 0;
  memset(&this->ExtractAnyLibraryName,0,0x20a);
  paVar2 = &(this->SharedRegexString).field_2;
  memset(&(this->LinkPrefixes)._M_t._M_impl.super__Rb_tree_header._M_node_count,0,0x212);
  (this->SharedRegexString)._M_dataplus._M_p = (pointer)paVar2;
  (this->SharedRegexString)._M_string_length = 0;
  (this->SharedRegexString).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->FrameworkPathsEmitted)._M_t._M_impl.super__Rb_tree_header;
  (this->FrameworkPathsEmitted)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->FrameworkPathsEmitted)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->FrameworkPathsEmitted)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->FrameworkPathsEmitted)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  local_1d0 = &this->ImplicitLinkDirs;
  p_Var1 = &(this->ImplicitLinkDirs)._M_t._M_impl.super__Rb_tree_header;
  (this->ImplicitLinkDirs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ImplicitLinkDirs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->FrameworkPathsEmitted)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->OrderLinkerSearchPath)._M_t.
  super___uniq_ptr_impl<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_>._M_t.
  super__Tuple_impl<0UL,_cmOrderDirectories_*,_std::default_delete<cmOrderDirectories>_>.
  super__Head_base<0UL,_cmOrderDirectories_*,_false>._M_head_impl = (cmOrderDirectories *)0x0;
  (this->ImplicitLinkDirs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->ImplicitLinkDirs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->ImplicitLinkDirs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->ImplicitLinkLibs)._M_t._M_impl.super__Rb_tree_header;
  (this->ImplicitLinkLibs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ImplicitLinkLibs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->ImplicitLinkLibs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->ImplicitLinkLibs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  local_1e0 = &this->RuntimeLinkDirs;
  local_1d8 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
               *)&this->OldLinkDirMask;
  p_Var1 = &(this->OldLinkDirMask)._M_t._M_impl.super__Rb_tree_header;
  (this->OldLinkDirMask)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->OldLinkDirMask)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->RuntimeLinkDirs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->RuntimeLinkDirs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ImplicitLinkLibs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->RuntimeLinkDirs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->OldLinkDirMask)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->OldLinkDirMask)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  p_Var3 = &(this->CMP0060WarnItems)._M_t._M_impl.super__Rb_tree_header;
  (this->CMP0060WarnItems)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->CMP0060WarnItems)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->OldLinkDirMask)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->OldLinkDirItems).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->OldLinkDirItems).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->OldLinkDirItems).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->OldUserFlagItems).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->OldUserFlagItems).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->OldUserFlagItems).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->CMP0060WarnItems)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header
  ;
  (this->CMP0060WarnItems)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var3->_M_header;
  local_2a8 = &this->OrderDependentRPath;
  local_2a0 = &this->OrderRuntimeSearchPath;
  local_2b0 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
               *)&this->LibraryFeatureDescriptors;
  p_Var3 = &(this->LibraryFeatureDescriptors)._M_t._M_impl.super__Rb_tree_header;
  (this->LibraryFeatureDescriptors)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->LibraryFeatureDescriptors)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->CMP0060WarnItems)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->OrderDependentRPath)._M_t.
  super___uniq_ptr_impl<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_>._M_t.
  super__Tuple_impl<0UL,_cmOrderDirectories_*,_std::default_delete<cmOrderDirectories>_>.
  super__Head_base<0UL,_cmOrderDirectories_*,_false>._M_head_impl = (cmOrderDirectories *)0x0;
  (this->OrderRuntimeSearchPath)._M_t.
  super___uniq_ptr_impl<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_>._M_t.
  super__Tuple_impl<0UL,_cmOrderDirectories_*,_std::default_delete<cmOrderDirectories>_>.
  super__Head_base<0UL,_cmOrderDirectories_*,_false>._M_head_impl = (cmOrderDirectories *)0x0;
  (this->LibraryFeatureDescriptors)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var3->_M_header;
  (this->LibraryFeatureDescriptors)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var3->_M_header;
  (this->LibraryFeatureDescriptors)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var3 = &(this->GroupFeatureDescriptors)._M_t._M_impl.super__Rb_tree_header;
  (this->GroupFeatureDescriptors)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->GroupFeatureDescriptors)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->GroupFeatureDescriptors)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var3->_M_header;
  (this->GroupFeatureDescriptors)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var3->_M_header;
  (this->GroupFeatureDescriptors)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_268 = paVar2;
  local_1c8 = &this->OrderLinkerSearchPath;
  this_01 = cmMakefile::GetState(this->Makefile);
  local_358._0_8_ = local_358 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_358,"FIND_LIBRARY_USE_OPENBSD_VERSIONING","");
  bVar9 = cmState::GetGlobalPropertyAsBool(this_01,(string *)local_358);
  this->IsOpenBSD = bVar9;
  if ((undefined1 *)local_358._0_8_ != local_358 + 0x10) {
    operator_delete((void *)local_358._0_8_,local_358._16_8_ + 1);
  }
  pcVar14 = (cmOrderDirectories *)operator_new(0x430);
  pcVar6 = local_1c0;
  cmOrderDirectories::cmOrderDirectories
            (pcVar14,this->GlobalGenerator,local_1c0,"linker search path");
  local_358._0_8_ = (pointer)0x0;
  std::__uniq_ptr_impl<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_>::reset
            ((__uniq_ptr_impl<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_> *)
             &this->OrderLinkerSearchPath,pcVar14);
  std::unique_ptr<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_>::~unique_ptr
            ((unique_ptr<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_> *)local_358);
  pcVar14 = (cmOrderDirectories *)operator_new(0x430);
  cmOrderDirectories::cmOrderDirectories(pcVar14,this->GlobalGenerator,pcVar6,"runtime search path")
  ;
  local_358._0_8_ = (pointer)0x0;
  std::__uniq_ptr_impl<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_>::reset
            ((__uniq_ptr_impl<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_> *)
             local_2a0,pcVar14);
  std::unique_ptr<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_>::~unique_ptr
            ((unique_ptr<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_> *)local_358);
  cmGeneratorTarget::GetLinkerLanguage((string *)local_358,this->Target,local_298);
  std::__cxx11::string::operator=((string *)local_270,(string *)local_358);
  pcVar18 = local_358 + 0x10;
  if ((pointer)local_358._0_8_ != pcVar18) {
    operator_delete((void *)local_358._0_8_,local_358._16_8_ + 1);
  }
  if ((this->LinkLanguage)._M_string_length != 0) {
    pcVar6 = this->Target;
    local_358._0_8_ = pcVar18;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_358,"LINK_DEPENDS_NO_SHARED","")
    ;
    bVar9 = cmGeneratorTarget::GetPropertyAsBool(pcVar6,(string *)local_358);
    this->LinkDependsNoShared = bVar9;
    if ((pointer)local_358._0_8_ != pcVar18) {
      operator_delete((void *)local_358._0_8_,local_358._16_8_ + 1);
    }
    bVar9 = cmGeneratorTarget::IsDLLPlatform(this->Target);
    if (!bVar9) {
      TVar10 = cmGeneratorTarget::GetType(this->Target);
      if (TVar10 == MODULE_LIBRARY) {
        local_358._0_8_ = (pointer)0x1b;
        local_358._8_8_ = "CMAKE_SHARED_MODULE_LOADER_";
        local_358._16_8_ = 0;
        local_358._32_8_ = (this->LinkLanguage)._M_dataplus._M_p;
        local_358._24_8_ = (this->LinkLanguage)._M_string_length;
        local_330._M_p = (pointer)0x0;
        local_328 = 5;
        local_320._M_allocated_capacity = (long)"_CMAKE_CUDA_RDC_FLAG" + 0xf;
        local_320._8_8_ = 0;
        views._M_len = 3;
        views._M_array = (iterator)local_358;
        cmCatViews(&local_388,views);
        cVar15 = cmMakefile::GetDefinition(this->Makefile,&local_388);
        (this->LoaderFlag).Value = cVar15.Value;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_388._M_dataplus._M_p != &local_388.field_2) {
          operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
        }
      }
    }
    pcVar12 = this->Makefile;
    local_358._0_8_ = &DAT_00000006;
    local_358._8_8_ = "CMAKE_";
    local_358._16_8_ = 0;
    local_358._32_8_ = (this->LinkLanguage)._M_dataplus._M_p;
    local_358._24_8_ = (this->LinkLanguage)._M_string_length;
    local_330._M_p = (pointer)0x0;
    local_328 = 0x12;
    local_320._M_allocated_capacity = (long)"CMAKE_LINK_LIBRARY_FLAG" + 5;
    local_320._8_8_ = 0;
    views_00._M_len = 3;
    views_00._M_array = (iterator)local_358;
    cmCatViews(&local_388,views_00);
    cVar15 = cmMakefile::GetDefinition(pcVar12,&local_388);
    paVar2 = &local_388.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_388._M_dataplus._M_p != paVar2) {
      operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
    }
    if (cVar15.Value == (string *)0x0) {
      pcVar12 = this->Makefile;
      local_358._0_8_ = pcVar18;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_358,"CMAKE_LINK_LIBRARY_FLAG","");
      cmMakefile::GetSafeDefinition(pcVar12,(string *)local_358);
      std::__cxx11::string::_M_assign(local_278);
      if ((pointer)local_358._0_8_ != pcVar18) {
        operator_delete((void *)local_358._0_8_,local_358._16_8_ + 1);
      }
    }
    else {
      std::__cxx11::string::_M_assign(local_278);
    }
    pcVar12 = this->Makefile;
    local_358._0_8_ = &DAT_00000006;
    local_358._8_8_ = "CMAKE_";
    local_358._16_8_ = 0;
    local_358._32_8_ = (this->LinkLanguage)._M_dataplus._M_p;
    local_358._24_8_ = (this->LinkLanguage)._M_string_length;
    local_330._M_p = (pointer)0x0;
    local_328 = 0x17;
    local_320._M_allocated_capacity = (long)"CMAKE_LINK_LIBRARY_FILE_FLAG" + 5;
    local_320._8_8_ = 0;
    views_01._M_len = 3;
    views_01._M_array = (iterator)local_358;
    cmCatViews(&local_388,views_01);
    cVar15 = cmMakefile::GetDefinition(pcVar12,&local_388);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_388._M_dataplus._M_p != paVar2) {
      operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
    }
    if (cVar15.Value == (string *)0x0) {
      pcVar12 = this->Makefile;
      local_358._0_8_ = pcVar18;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_358,"CMAKE_LINK_LIBRARY_FILE_FLAG","");
      cmMakefile::GetSafeDefinition(pcVar12,(string *)local_358);
      std::__cxx11::string::_M_assign(local_280);
      if ((pointer)local_358._0_8_ != pcVar18) {
        operator_delete((void *)local_358._0_8_,local_358._16_8_ + 1);
      }
    }
    else {
      std::__cxx11::string::_M_assign(local_280);
    }
    pcVar12 = this->Makefile;
    local_358._0_8_ = &DAT_00000006;
    local_358._8_8_ = "CMAKE_";
    local_358._16_8_ = 0;
    local_358._32_8_ = (this->LinkLanguage)._M_dataplus._M_p;
    local_358._24_8_ = (this->LinkLanguage)._M_string_length;
    local_330._M_p = (pointer)0x0;
    local_328 = 0x14;
    local_320._M_allocated_capacity = (long)"CMAKE_LINK_LIBRARY_SUFFIX" + 5;
    local_320._8_8_ = 0;
    views_02._M_len = 3;
    views_02._M_array = (iterator)local_358;
    cmCatViews(&local_388,views_02);
    cVar15 = cmMakefile::GetDefinition(pcVar12,&local_388);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_388._M_dataplus._M_p != paVar2) {
      operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
    }
    if (cVar15.Value == (string *)0x0) {
      pcVar12 = this->Makefile;
      local_358._0_8_ = pcVar18;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_358,"CMAKE_LINK_LIBRARY_SUFFIX","");
      cmMakefile::GetSafeDefinition(pcVar12,(string *)local_358);
      std::__cxx11::string::_M_assign(local_288);
      if ((pointer)local_358._0_8_ != pcVar18) {
        operator_delete((void *)local_358._0_8_,local_358._16_8_ + 1);
      }
    }
    else {
      std::__cxx11::string::_M_assign(local_288);
    }
    pcVar12 = this->Makefile;
    local_358._0_8_ = &DAT_00000006;
    local_358._8_8_ = "CMAKE_";
    local_358._16_8_ = 0;
    local_358._32_8_ = (this->LinkLanguage)._M_dataplus._M_p;
    local_358._24_8_ = (this->LinkLanguage)._M_string_length;
    local_330._M_p = (pointer)0x0;
    local_328 = 0x16;
    local_320._M_allocated_capacity = (long)"CMAKE_LINK_OBJECT_FILE_FLAG" + 5;
    local_320._8_8_ = 0;
    views_03._M_len = 3;
    views_03._M_array = (iterator)local_358;
    cmCatViews(&local_388,views_03);
    cVar15 = cmMakefile::GetDefinition(pcVar12,&local_388);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_388._M_dataplus._M_p != paVar2) {
      operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
    }
    if (cVar15.Value == (string *)0x0) {
      pcVar12 = this->Makefile;
      local_358._0_8_ = pcVar18;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_358,"CMAKE_LINK_OBJECT_FILE_FLAG","");
      cmMakefile::GetSafeDefinition(pcVar12,(string *)local_358);
      std::__cxx11::string::_M_assign(local_290);
      if ((pointer)local_358._0_8_ != pcVar18) {
        operator_delete((void *)local_358._0_8_,local_358._16_8_ + 1);
      }
    }
    else {
      std::__cxx11::string::_M_assign(local_290);
    }
    this->RuntimeUseChrpath = false;
    TVar10 = cmGeneratorTarget::GetType(this->Target);
    if (TVar10 != STATIC_LIBRARY) {
      TVar10 = cmGeneratorTarget::GetType(this->Target);
      pcVar17 = "SHARED_LIBRARY";
      if (TVar10 == EXECUTABLE) {
        pcVar17 = "EXECUTABLE";
      }
      local_358._0_8_ = &DAT_00000006;
      local_358._8_8_ = "CMAKE_";
      local_358._16_8_ = 0;
      lVar4 = (ulong)(TVar10 != EXECUTABLE) * 4 + 10;
      local_330._M_p = (pointer)0x0;
      local_328 = 9;
      local_320._M_allocated_capacity = (long)"CMAKE_SHARED_LIBRARY_RUNTIME_" + 0x14;
      local_320._8_8_ = 0;
      local_308 = (this->LinkLanguage)._M_dataplus._M_p;
      local_310._M_p = (pointer)(this->LinkLanguage)._M_string_length;
      local_300._M_allocated_capacity = 0;
      local_300._8_8_ = 5;
      local_2f0._M_p = "_FLAG";
      local_2e8 = 0;
      views_04._M_len = 5;
      views_04._M_array = (iterator)local_358;
      local_358._24_8_ = lVar4;
      local_358._32_8_ = pcVar17;
      cmCatViews(&local_388,views_04);
      local_358._0_8_ = local_388._M_string_length;
      local_358._8_8_ = local_388._M_dataplus._M_p;
      local_358._16_8_ = 0;
      local_358._24_8_ = 4;
      local_358._32_8_ = "_SEP";
      local_330._M_p = (pointer)0x0;
      views_05._M_len = 2;
      views_05._M_array = (iterator)local_358;
      cmCatViews(&local_50,views_05);
      cmMakefile::GetSafeDefinition(this->Makefile,&local_388);
      std::__cxx11::string::_M_assign(local_1e8);
      cmMakefile::GetSafeDefinition(this->Makefile,&local_50);
      std::__cxx11::string::_M_assign(local_1f0);
      pcVar12 = this->Makefile;
      local_358._0_8_ = local_358 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_358,"CMAKE_PLATFORM_REQUIRED_RUNTIME_PATH","");
      cmMakefile::GetSafeDefinition(pcVar12,(string *)local_358);
      std::__cxx11::string::_M_assign(local_1f8);
      if ((undefined1 *)local_358._0_8_ != local_358 + 0x10) {
        operator_delete((void *)local_358._0_8_,local_358._16_8_ + 1);
      }
      bVar9 = cmGeneratorTarget::IsChrpathUsed(this->Target,local_298);
      this->RuntimeUseChrpath = bVar9;
      local_358._0_8_ = &DAT_00000006;
      local_358._8_8_ = "CMAKE_";
      local_358._16_8_ = 0;
      local_330._M_p = (pointer)0x0;
      local_328 = 0xc;
      local_320._M_allocated_capacity = 0x80ba06;
      local_320._8_8_ = 0;
      local_308 = (this->LinkLanguage)._M_dataplus._M_p;
      local_310._M_p = (pointer)(this->LinkLanguage)._M_string_length;
      local_300._M_allocated_capacity = 0;
      local_300._8_8_ = 5;
      local_2f0._M_p = "_FLAG";
      local_2e8 = 0;
      views_06._M_len = 5;
      views_06._M_array = (iterator)local_358;
      local_358._24_8_ = lVar4;
      local_358._32_8_ = pcVar17;
      cmCatViews(&local_70,views_06);
      cmMakefile::GetSafeDefinition(this->Makefile,&local_70);
      std::__cxx11::string::_M_assign(local_200);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_388._M_dataplus._M_p != &local_388.field_2) {
        operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
      }
    }
    pcVar18 = local_358 + 0x10;
    local_358._0_8_ = (pointer)0x1a;
    local_358._8_8_ = "CMAKE_SHARED_LIBRARY_LINK_";
    local_358._16_8_ = 0;
    local_358._32_8_ = (this->LinkLanguage)._M_dataplus._M_p;
    local_358._24_8_ = (this->LinkLanguage)._M_string_length;
    local_330._M_p = (pointer)0x0;
    local_328 = 0x12;
    local_320._M_allocated_capacity = 0x80ba13;
    local_320._8_8_ = 0;
    views_07._M_len = 3;
    views_07._M_array = (iterator)local_358;
    cmCatViews(&local_388,views_07);
    bVar9 = cmMakefile::IsOn(this->Makefile,&local_388);
    this->LinkWithRuntimePath = bVar9;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_388._M_dataplus._M_p != &local_388.field_2) {
      operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
    }
    if ((this->LibLinkFileFlag)._M_string_length != 0) {
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"__CMAKE_LINK_LIBRARY","")
      ;
      local_388._M_string_length = (size_type)(this->LibLinkFileFlag)._M_dataplus._M_p;
      local_388._M_dataplus._M_p = (pointer)(this->LibLinkFileFlag)._M_string_length;
      local_388.field_2._M_allocated_capacity = 0;
      local_388.field_2._8_8_ = 9;
      local_368 = "<LIBRARY>";
      local_360 = 0;
      views_08._M_len = 2;
      views_08._M_array = (iterator)&local_388;
      cmCatViews(&local_90,views_08);
      LibraryFeatureDescriptor::LibraryFeatureDescriptor
                ((LibraryFeatureDescriptor *)local_358,&local_f0,&local_90);
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
      ::_M_emplace_unique<char_const(&)[21],cmComputeLinkInformation::LibraryFeatureDescriptor>
                (local_2b0,(char (*) [21])"__CMAKE_LINK_LIBRARY",
                 (LibraryFeatureDescriptor *)local_358);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0._M_p != &local_2c0) {
        operator_delete(local_2d0._M_p,local_2c0._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0._M_p != &local_2e0) {
        operator_delete(local_2f0._M_p,local_2e0._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_310._M_p != &local_300) {
        operator_delete(local_310._M_p,local_300._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_330._M_p != &local_320) {
        operator_delete(local_330._M_p,(ulong)(local_320._M_allocated_capacity + 1));
      }
      if ((pointer)local_358._0_8_ != pcVar18) {
        operator_delete((void *)local_358._0_8_,local_358._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
    }
    if ((this->ObjLinkFileFlag)._M_string_length != 0) {
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"__CMAKE_LINK_OBJECT","")
      ;
      local_388._M_string_length = (size_type)(this->ObjLinkFileFlag)._M_dataplus._M_p;
      local_388._M_dataplus._M_p = (pointer)(this->ObjLinkFileFlag)._M_string_length;
      local_388.field_2._M_allocated_capacity = 0;
      local_388.field_2._8_8_ = 9;
      local_368 = "<LIBRARY>";
      local_360 = 0;
      views_09._M_len = 2;
      views_09._M_array = (iterator)&local_388;
      cmCatViews(&local_b0,views_09);
      LibraryFeatureDescriptor::LibraryFeatureDescriptor
                ((LibraryFeatureDescriptor *)local_358,&local_110,&local_b0);
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
      ::_M_emplace_unique<char_const(&)[20],cmComputeLinkInformation::LibraryFeatureDescriptor>
                (local_2b0,(char (*) [20])"__CMAKE_LINK_OBJECT",
                 (LibraryFeatureDescriptor *)local_358);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0._M_p != &local_2c0) {
        operator_delete(local_2d0._M_p,local_2c0._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0._M_p != &local_2e0) {
        operator_delete(local_2f0._M_p,local_2e0._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_310._M_p != &local_300) {
        operator_delete(local_310._M_p,local_300._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_330._M_p != &local_320) {
        operator_delete(local_330._M_p,(ulong)(local_320._M_allocated_capacity + 1));
      }
      if ((pointer)local_358._0_8_ != pcVar18) {
        operator_delete((void *)local_358._0_8_,local_358._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
      }
    }
    psVar16 = (this->LoaderFlag).Value;
    if (psVar16 == (string *)0x0) {
      psVar16 = &cmValue::Empty_abi_cxx11_;
    }
    if (psVar16->_M_string_length != 0) {
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_130,"__CMAKE_LINK_EXECUTABLE","");
      psVar16 = (this->LoaderFlag).Value;
      if (psVar16 == (string *)0x0) {
        psVar16 = &cmValue::Empty_abi_cxx11_;
      }
      local_388._M_string_length = (size_type)(psVar16->_M_dataplus)._M_p;
      local_388._M_dataplus._M_p = (pointer)psVar16->_M_string_length;
      local_388.field_2._M_allocated_capacity = 0;
      local_388.field_2._8_8_ = 9;
      local_368 = "<LIBRARY>";
      local_360 = 0;
      views_10._M_len = 2;
      views_10._M_array = (iterator)&local_388;
      cmCatViews(&local_d0,views_10);
      LibraryFeatureDescriptor::LibraryFeatureDescriptor
                ((LibraryFeatureDescriptor *)local_358,&local_130,&local_d0);
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
      ::_M_emplace_unique<char_const(&)[24],cmComputeLinkInformation::LibraryFeatureDescriptor>
                (local_2b0,(char (*) [24])"__CMAKE_LINK_EXECUTABLE",
                 (LibraryFeatureDescriptor *)local_358);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0._M_p != &local_2c0) {
        operator_delete(local_2d0._M_p,local_2c0._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0._M_p != &local_2e0) {
        operator_delete(local_2f0._M_p,local_2e0._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_310._M_p != &local_300) {
        operator_delete(local_310._M_p,local_300._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_330._M_p != &local_320) {
        operator_delete(local_330._M_p,(ulong)(local_320._M_allocated_capacity + 1));
      }
      if ((pointer)local_358._0_8_ != pcVar18) {
        operator_delete((void *)local_358._0_8_,local_358._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
      }
    }
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_150,"__CMAKE_LINK_FRAMEWORK","");
    local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"<LIBRARY>","");
    LibraryFeatureDescriptor::LibraryFeatureDescriptor
              ((LibraryFeatureDescriptor *)local_358,&local_150,&local_170);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
    ::_M_emplace_unique<char_const(&)[23],cmComputeLinkInformation::LibraryFeatureDescriptor>
              (local_2b0,(char (*) [23])"__CMAKE_LINK_FRAMEWORK",
               (LibraryFeatureDescriptor *)local_358);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_p != &local_2c0) {
      operator_delete(local_2d0._M_p,local_2c0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_p != &local_2e0) {
      operator_delete(local_2f0._M_p,local_2e0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_310._M_p != &local_300) {
      operator_delete(local_310._M_p,local_300._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330._M_p != &local_320) {
      operator_delete(local_330._M_p,(ulong)(local_320._M_allocated_capacity + 1));
    }
    if ((undefined1 *)local_358._0_8_ != local_358 + 0x10) {
      operator_delete((void *)local_358._0_8_,local_358._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
    local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1b8,"__CMAKE_LINK_XCFRAMEWORK","");
    local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"<LIBRARY>","");
    LibraryFeatureDescriptor::LibraryFeatureDescriptor
              ((LibraryFeatureDescriptor *)local_358,&local_1b8,&local_190);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
    ::_M_emplace_unique<char_const(&)[25],cmComputeLinkInformation::LibraryFeatureDescriptor>
              (local_2b0,(char (*) [25])"__CMAKE_LINK_XCFRAMEWORK",
               (LibraryFeatureDescriptor *)local_358);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_p != &local_2c0) {
      operator_delete(local_2d0._M_p,local_2c0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_p != &local_2e0) {
      operator_delete(local_2f0._M_p,local_2e0._M_allocated_capacity + 1);
    }
    pcVar18 = local_358 + 0x10;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_310._M_p != &local_300) {
      operator_delete(local_310._M_p,local_300._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330._M_p != &local_320) {
      operator_delete(local_330._M_p,(ulong)(local_320._M_allocated_capacity + 1));
    }
    puVar8 = local_1c8;
    if ((pointer)local_358._0_8_ != pcVar18) {
      operator_delete((void *)local_358._0_8_,local_358._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != &local_190.field_2) {
      operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    }
    pcVar12 = this->Makefile;
    local_358._0_8_ = pcVar18;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_358,"CMAKE_PLATFORM_USES_PATH_WHEN_NO_SONAME","");
    bVar9 = cmMakefile::IsOn(pcVar12,(string *)local_358);
    this->NoSONameUsesPath = bVar9;
    if ((pointer)local_358._0_8_ != pcVar18) {
      operator_delete((void *)local_358._0_8_,local_358._16_8_ + 1);
    }
    ComputeLinkTypeInfo(this);
    ComputeItemParserInfo(this);
    ComputeFrameworkInfo(this);
    this->SharedDependencyMode = SharedDepModeNone;
    pcVar12 = this->Makefile;
    local_358._0_8_ = pcVar18;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_358,"CMAKE_LINK_DEPENDENT_LIBRARY_FILES","");
    bVar9 = cmMakefile::IsOn(pcVar12,(string *)local_358);
    pcVar6 = local_1c0;
    if ((pointer)local_358._0_8_ != pcVar18) {
      operator_delete((void *)local_358._0_8_,local_358._16_8_ + 1);
    }
    if (bVar9) {
      this->SharedDependencyMode = SharedDepModeLink;
    }
    else {
      pcVar12 = this->Makefile;
      local_358._0_8_ = pcVar18;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_358,"CMAKE_LINK_DEPENDENT_LIBRARY_DIRS","");
      bVar9 = cmMakefile::IsOn(pcVar12,(string *)local_358);
      if ((pointer)local_358._0_8_ != pcVar18) {
        operator_delete((void *)local_358._0_8_,local_358._16_8_ + 1);
      }
      if (bVar9) {
        this->SharedDependencyMode = SharedDepModeLibDir;
      }
      else if ((this->RPathLinkFlag)._M_string_length != 0) {
        this->SharedDependencyMode = SharedDepModeDir;
        pcVar14 = (cmOrderDirectories *)operator_new(0x430);
        cmOrderDirectories::cmOrderDirectories
                  (pcVar14,this->GlobalGenerator,pcVar6,"dependent library path");
        local_358._0_8_ = (pointer)0x0;
        std::__uniq_ptr_impl<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_>::reset
                  ((__uniq_ptr_impl<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_> *)
                   local_2a8,pcVar14);
        std::unique_ptr<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_>::~unique_ptr
                  ((unique_ptr<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_> *)
                   local_358);
      }
    }
    implicitDirs = local_1d0;
    local_388._M_dataplus._M_p = (pointer)0x0;
    local_388._M_string_length = 0;
    local_388.field_2._M_allocated_capacity = 0;
    cmGeneratorTarget::GetLinkDirectories
              (this->Target,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_388,local_298,local_270);
    cmOrderDirectories::AddUserDirectories
              ((puVar8->_M_t).
               super___uniq_ptr_impl<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmOrderDirectories_*,_std::default_delete<cmOrderDirectories>_>
               .super__Head_base<0UL,_cmOrderDirectories_*,_false>._M_head_impl,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_388);
    cmOrderDirectories::AddUserDirectories
              ((local_2a0->_M_t).
               super___uniq_ptr_impl<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmOrderDirectories_*,_std::default_delete<cmOrderDirectories>_>
               .super__Head_base<0UL,_cmOrderDirectories_*,_false>._M_head_impl,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_388);
    LoadImplicitLinkInfo(this);
    cmOrderDirectories::SetImplicitDirectories
              ((puVar8->_M_t).
               super___uniq_ptr_impl<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmOrderDirectories_*,_std::default_delete<cmOrderDirectories>_>
               .super__Head_base<0UL,_cmOrderDirectories_*,_false>._M_head_impl,implicitDirs);
    cmOrderDirectories::SetImplicitDirectories
              ((local_2a0->_M_t).
               super___uniq_ptr_impl<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmOrderDirectories_*,_std::default_delete<cmOrderDirectories>_>
               .super__Head_base<0UL,_cmOrderDirectories_*,_false>._M_head_impl,implicitDirs);
    pcVar14 = (local_2a8->_M_t).
              super___uniq_ptr_impl<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_>.
              _M_t.
              super__Tuple_impl<0UL,_cmOrderDirectories_*,_std::default_delete<cmOrderDirectories>_>
              .super__Head_base<0UL,_cmOrderDirectories_*,_false>._M_head_impl;
    if (pcVar14 != (cmOrderDirectories *)0x0) {
      cmOrderDirectories::SetImplicitDirectories(pcVar14,implicitDirs);
      cmOrderDirectories::AddLanguageDirectories
                ((local_2a8->_M_t).
                 super___uniq_ptr_impl<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmOrderDirectories_*,_std::default_delete<cmOrderDirectories>_>
                 .super__Head_base<0UL,_cmOrderDirectories_*,_false>._M_head_impl,local_1e0);
    }
    PVar11 = cmPolicies::PolicyMap::Get(&this->Target->PolicyMap,CMP0003);
    this_00 = local_1d8;
    sVar7 = local_388._M_string_length;
    this->OldLinkDirMode = PVar11 != NEW;
    if (PVar11 != NEW) {
      local_358._0_8_ = local_1d8;
      if (local_388._M_dataplus._M_p != (pointer)local_388._M_string_length) {
        __v._M_p = local_388._M_dataplus._M_p;
        do {
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::
          _M_insert_unique_<std::__cxx11::string&,std::_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::_Alloc_node>
                    (this_00,(const_iterator)p_Var1,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__v._M_p,
                     (_Alloc_node *)local_358);
          __v._M_p = __v._M_p + 0x20;
        } while (__v._M_p != (pointer)sVar7);
      }
    }
    pcVar12 = this->Makefile;
    local_358._0_8_ = pcVar18;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_358,"CMAKE_POLICY_WARNING_CMP0060","");
    bVar9 = cmMakefile::PolicyOptionalWarningEnabled(pcVar12,(string *)local_358);
    this->CMP0060Warn = bVar9;
    if ((pointer)local_358._0_8_ != pcVar18) {
      operator_delete((void *)local_358._0_8_,local_358._16_8_ + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_388);
  }
  return;
}

Assistant:

cmComputeLinkInformation::cmComputeLinkInformation(
  const cmGeneratorTarget* target, const std::string& config)
  // Store context information.
  : Target(target)
  , Makefile(target->Target->GetMakefile())
  , GlobalGenerator(target->GetLocalGenerator()->GetGlobalGenerator())
  , CMakeInstance(this->GlobalGenerator->GetCMakeInstance())
  // The configuration being linked.
  , Config(config)
{
  // Check whether to recognize OpenBSD-style library versioned names.
  this->IsOpenBSD = this->Makefile->GetState()->GetGlobalPropertyAsBool(
    "FIND_LIBRARY_USE_OPENBSD_VERSIONING");

  // Allocate internals.
  this->OrderLinkerSearchPath = cm::make_unique<cmOrderDirectories>(
    this->GlobalGenerator, target, "linker search path");
  this->OrderRuntimeSearchPath = cm::make_unique<cmOrderDirectories>(
    this->GlobalGenerator, target, "runtime search path");

  // Get the language used for linking this target.
  this->LinkLanguage = this->Target->GetLinkerLanguage(config);
  if (this->LinkLanguage.empty()) {
    // The Compute method will do nothing, so skip the rest of the
    // initialization.
    return;
  }

  // Check whether we should skip dependencies on shared library files.
  this->LinkDependsNoShared =
    this->Target->GetPropertyAsBool("LINK_DEPENDS_NO_SHARED");

  // On platforms without import libraries there may be a special flag
  // to use when creating a plugin (module) that obtains symbols from
  // the program that will load it.
  if (!this->Target->IsDLLPlatform() &&
      this->Target->GetType() == cmStateEnums::MODULE_LIBRARY) {
    std::string loader_flag_var =
      cmStrCat("CMAKE_SHARED_MODULE_LOADER_", this->LinkLanguage, "_FLAG");
    this->LoaderFlag = this->Makefile->GetDefinition(loader_flag_var);
  }

  // Get options needed to link libraries.
  if (cmValue flag = this->Makefile->GetDefinition(
        cmStrCat("CMAKE_", this->LinkLanguage, "_LINK_LIBRARY_FLAG"))) {
    this->LibLinkFlag = *flag;
  } else {
    this->LibLinkFlag =
      this->Makefile->GetSafeDefinition("CMAKE_LINK_LIBRARY_FLAG");
  }
  if (cmValue flag = this->Makefile->GetDefinition(
        cmStrCat("CMAKE_", this->LinkLanguage, "_LINK_LIBRARY_FILE_FLAG"))) {
    this->LibLinkFileFlag = *flag;
  } else {
    this->LibLinkFileFlag =
      this->Makefile->GetSafeDefinition("CMAKE_LINK_LIBRARY_FILE_FLAG");
  }
  if (cmValue suffix = this->Makefile->GetDefinition(
        cmStrCat("CMAKE_", this->LinkLanguage, "_LINK_LIBRARY_SUFFIX"))) {
    this->LibLinkSuffix = *suffix;
  } else {
    this->LibLinkSuffix =
      this->Makefile->GetSafeDefinition("CMAKE_LINK_LIBRARY_SUFFIX");
  }
  if (cmValue flag = this->Makefile->GetDefinition(
        cmStrCat("CMAKE_", this->LinkLanguage, "_LINK_OBJECT_FILE_FLAG"))) {
    this->ObjLinkFileFlag = *flag;
  } else {
    this->ObjLinkFileFlag =
      this->Makefile->GetSafeDefinition("CMAKE_LINK_OBJECT_FILE_FLAG");
  }

  // Get options needed to specify RPATHs.
  this->RuntimeUseChrpath = false;
  if (this->Target->GetType() != cmStateEnums::STATIC_LIBRARY) {
    const char* tType = ((this->Target->GetType() == cmStateEnums::EXECUTABLE)
                           ? "EXECUTABLE"
                           : "SHARED_LIBRARY");
    std::string rtVar =
      cmStrCat("CMAKE_", tType, "_RUNTIME_", this->LinkLanguage, "_FLAG");
    std::string rtSepVar = cmStrCat(rtVar, "_SEP");
    this->RuntimeFlag = this->Makefile->GetSafeDefinition(rtVar);
    this->RuntimeSep = this->Makefile->GetSafeDefinition(rtSepVar);
    this->RuntimeAlways = (this->Makefile->GetSafeDefinition(
      "CMAKE_PLATFORM_REQUIRED_RUNTIME_PATH"));

    this->RuntimeUseChrpath = this->Target->IsChrpathUsed(config);

    // Get options needed to help find dependent libraries.
    std::string rlVar =
      cmStrCat("CMAKE_", tType, "_RPATH_LINK_", this->LinkLanguage, "_FLAG");
    this->RPathLinkFlag = this->Makefile->GetSafeDefinition(rlVar);
  }

  // Check if we need to include the runtime search path at link time.
  {
    std::string var = cmStrCat("CMAKE_SHARED_LIBRARY_LINK_",
                               this->LinkLanguage, "_WITH_RUNTIME_PATH");
    this->LinkWithRuntimePath = this->Makefile->IsOn(var);
  }

  // Define some Feature descriptors to handle standard library and object link
  if (!this->GetLibLinkFileFlag().empty()) {
    this->LibraryFeatureDescriptors.emplace(
      "__CMAKE_LINK_LIBRARY",
      LibraryFeatureDescriptor{
        "__CMAKE_LINK_LIBRARY",
        cmStrCat(this->GetLibLinkFileFlag(), "<LIBRARY>") });
  }
  if (!this->GetObjLinkFileFlag().empty()) {
    this->LibraryFeatureDescriptors.emplace(
      "__CMAKE_LINK_OBJECT",
      LibraryFeatureDescriptor{
        "__CMAKE_LINK_OBJECT",
        cmStrCat(this->GetObjLinkFileFlag(), "<LIBRARY>") });
  }
  if (!this->LoaderFlag->empty()) {
    // Define a Feature descriptor for the link of an executable with exports
    this->LibraryFeatureDescriptors.emplace(
      "__CMAKE_LINK_EXECUTABLE",
      LibraryFeatureDescriptor{ "__CMAKE_LINK_EXECUTABLE",
                                cmStrCat(*this->LoaderFlag, "<LIBRARY>") });
  }
  // To link framework using a full path
  this->LibraryFeatureDescriptors.emplace(
    "__CMAKE_LINK_FRAMEWORK",
    LibraryFeatureDescriptor{ "__CMAKE_LINK_FRAMEWORK", "<LIBRARY>" });
  // To link xcframework using a full path
  this->LibraryFeatureDescriptors.emplace(
    "__CMAKE_LINK_XCFRAMEWORK",
    LibraryFeatureDescriptor{ "__CMAKE_LINK_XCFRAMEWORK", "<LIBRARY>" });

  // Check the platform policy for missing soname case.
  this->NoSONameUsesPath =
    this->Makefile->IsOn("CMAKE_PLATFORM_USES_PATH_WHEN_NO_SONAME");

  // Get link type information.
  this->ComputeLinkTypeInfo();

  // Setup the link item parser.
  this->ComputeItemParserInfo();

  // Setup framework support.
  this->ComputeFrameworkInfo();

  // Choose a mode for dealing with shared library dependencies.
  this->SharedDependencyMode = SharedDepModeNone;
  if (this->Makefile->IsOn("CMAKE_LINK_DEPENDENT_LIBRARY_FILES")) {
    this->SharedDependencyMode = SharedDepModeLink;
  } else if (this->Makefile->IsOn("CMAKE_LINK_DEPENDENT_LIBRARY_DIRS")) {
    this->SharedDependencyMode = SharedDepModeLibDir;
  } else if (!this->RPathLinkFlag.empty()) {
    this->SharedDependencyMode = SharedDepModeDir;
    this->OrderDependentRPath = cm::make_unique<cmOrderDirectories>(
      this->GlobalGenerator, target, "dependent library path");
  }

  // Add the search path entries requested by the user to path ordering.
  std::vector<std::string> directories;
  this->Target->GetLinkDirectories(directories, config, this->LinkLanguage);
  this->OrderLinkerSearchPath->AddUserDirectories(directories);
  this->OrderRuntimeSearchPath->AddUserDirectories(directories);

  // Set up the implicit link directories.
  this->LoadImplicitLinkInfo();
  this->OrderLinkerSearchPath->SetImplicitDirectories(this->ImplicitLinkDirs);
  this->OrderRuntimeSearchPath->SetImplicitDirectories(this->ImplicitLinkDirs);
  if (this->OrderDependentRPath) {
    this->OrderDependentRPath->SetImplicitDirectories(this->ImplicitLinkDirs);
    this->OrderDependentRPath->AddLanguageDirectories(this->RuntimeLinkDirs);
  }

  // Decide whether to enable compatible library search path mode.
  // There exists code that effectively does
  //
  //    /path/to/libA.so -lB
  //
  // where -lB is meant to link to /path/to/libB.so.  This is broken
  // because it specified -lB without specifying a link directory (-L)
  // in which to search for B.  This worked in CMake 2.4 and below
  // because -L/path/to would be added by the -L/-l split for A.  In
  // order to support such projects we need to add the directories
  // containing libraries linked with a full path to the -L path.
  this->OldLinkDirMode =
    this->Target->GetPolicyStatusCMP0003() != cmPolicies::NEW;
  if (this->OldLinkDirMode) {
    // Construct a mask to not bother with this behavior for link
    // directories already specified by the user.
    this->OldLinkDirMask.insert(directories.begin(), directories.end());
  }

  this->CMP0060Warn = this->Makefile->PolicyOptionalWarningEnabled(
    "CMAKE_POLICY_WARNING_CMP0060");
}